

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_symbol_get_description(JSContext *ctx,JSValue this_val)

{
  JSValue v;
  JSValue JVar1;
  int iVar2;
  long in_RDI;
  JSValue JVar3;
  JSAtomStruct *p;
  JSValue ret;
  JSValue val;
  JSValueUnion in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_10;
  undefined8 local_8;
  
  JVar3.tag._0_4_ = in_stack_ffffffffffffff90;
  JVar3.u.ptr = (void *)in_stack_ffffffffffffff88;
  JVar3.tag._4_4_ = in_stack_ffffffffffffff94;
  JVar3 = js_thisSymbolValue((JSContext *)in_stack_ffffffffffffff80.ptr,JVar3);
  local_60 = JVar3.u;
  local_58 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    if (((*(ulong *)((long)local_60 + 4) & 0x7fffffff) == 0) &&
       ((*(ulong *)((long)local_60 + 4) >> 0x1f & 1) != 0)) {
      in_stack_ffffffffffffff90 = 0;
      local_48 = (void *)((ulong)in_stack_ffffffffffffff94 << 0x20);
      local_40 = 3;
    }
    else {
      js_get_atom_index(*(JSRuntime **)(in_RDI + 0x18),(JSAtomStruct *)local_60);
      JVar3 = JS_AtomToString((JSContext *)in_stack_ffffffffffffff80.ptr,
                              (JSAtom)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffff80 = JVar3.u;
      in_stack_ffffffffffffff88 = JVar3.tag;
      local_48 = in_stack_ffffffffffffff80;
      local_40 = in_stack_ffffffffffffff88;
    }
    v.tag._0_4_ = in_stack_ffffffffffffff90;
    v.u.ptr = (void *)in_stack_ffffffffffffff88;
    v.tag._4_4_ = in_stack_ffffffffffffff94;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff80.ptr,v);
    local_10 = local_48;
    local_8 = local_40;
  }
  else {
    local_10 = local_60;
    local_8 = local_58;
  }
  JVar1.tag = local_8;
  JVar1.u.ptr = local_10;
  return JVar1;
}

Assistant:

static JSValue js_symbol_get_description(JSContext *ctx, JSValueConst this_val)
{
    JSValue val, ret;
    JSAtomStruct *p;

    val = js_thisSymbolValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_PTR(val);
    if (p->len == 0 && p->is_wide_char != 0) {
        ret = JS_UNDEFINED;
    } else {
        ret = JS_AtomToString(ctx, js_get_atom_index(ctx->rt, p));
    }
    JS_FreeValue(ctx, val);
    return ret;
}